

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O0

REF_STATUS ref_sort_heap_int(REF_INT n,REF_INT *original,REF_INT *sorted_index)

{
  int local_38;
  int local_34;
  REF_INT q;
  REF_INT indxt;
  REF_INT ir;
  REF_INT l;
  REF_INT j;
  REF_INT i;
  REF_INT *sorted_index_local;
  REF_INT *original_local;
  REF_INT n_local;
  
  for (l = 0; l < n; l = l + 1) {
    sorted_index[l] = l;
  }
  if (n < 2) {
    return 0;
  }
  indxt = (n >> 1) + 1;
  q = n + -1;
  do {
    if (indxt < 2) {
      local_34 = sorted_index[q];
      local_38 = original[local_34];
      sorted_index[q] = *sorted_index;
      q = q + -1;
      if (q == 0) {
        *sorted_index = local_34;
        return 0;
      }
    }
    else {
      local_34 = sorted_index[indxt + -2];
      local_38 = original[local_34];
      indxt = indxt + -1;
    }
    l = indxt + -1;
    for (ir = indxt + l; ir <= q; ir = (ir + 1) * 2 + -1) {
      if ((ir < q) && (original[sorted_index[ir]] < original[sorted_index[ir + 1]])) {
        ir = ir + 1;
      }
      if (original[sorted_index[ir]] <= local_38) break;
      sorted_index[l] = sorted_index[ir];
      l = ir;
    }
    sorted_index[l] = local_34;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_sort_heap_int(REF_INT n, REF_INT *original,
                                     REF_INT *sorted_index) {
  REF_INT i, j, l, ir, indxt, q;

  for (i = 0; i < n; i++) sorted_index[i] = i;

  if (n < 2) return REF_SUCCESS;

  l = (n >> 1) + 1;
  ir = n - 1;
  for (;;) {
    if (l > 1) {
      l--;
      indxt = sorted_index[l - 1];
      q = original[indxt];
    } else {
      indxt = sorted_index[ir];
      q = original[indxt];
      sorted_index[ir] = sorted_index[0];
      if (--ir == 0) {
        sorted_index[0] = indxt;
        break;
      }
    }
    i = l - 1;
    j = l + i;

    while (j <= ir) {
      if (j < ir) {
        if (original[sorted_index[j]] < original[sorted_index[j + 1]]) j++;
      }
      if (q < original[sorted_index[j]]) {
        sorted_index[i] = sorted_index[j];
        i = j;

        j++;
        j <<= 1;
        j--;

      } else
        break;
    }
    sorted_index[i] = indxt;
  }

  return REF_SUCCESS;
}